

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NortekDVL.h
# Opt level: O1

int ConnectNortekDVL(NORTEKDVL *pNortekDVL,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char line [256];
  char local_138;
  char local_137;
  
  memset(pNortekDVL->szCfgFilePath,0,0x100);
  sprintf(pNortekDVL->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_138,0,0x100);
    memset(pNortekDVL->szDevPath + 5,0,0xfb);
    builtin_strncpy(pNortekDVL->szDevPath,"COM1",5);
    pNortekDVL->BaudRate = 0x2580;
    pNortekDVL->timeout = 0x5dc;
    pNortekDVL->threadperiod = 100;
    pNortekDVL->bSaveRawData = 1;
    pNortekDVL->bEnable_PD6_SA = 0;
    pNortekDVL->bEnable_PD6_TS = 0;
    pNortekDVL->bEnable_PD6_BI = 0;
    pNortekDVL->bEnable_PD6_BS = 1;
    pNortekDVL->bEnable_PD6_BE = 0;
    pNortekDVL->bEnable_PD6_BD = 0;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001b647b;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001b647b:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%255s",pNortekDVL->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001b64fa;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001b64fa:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNortekDVL->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001b6579;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001b6579:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNortekDVL->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001b65f8;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001b65f8:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNortekDVL->threadperiod);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001b6679;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001b6679:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNortekDVL->bSaveRawData);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001b66fa;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001b66fa:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNortekDVL->bEnable_PD6_SA);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001b677b;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001b677b:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNortekDVL->bEnable_PD6_TS);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001b67fc;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001b67fc:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNortekDVL->bEnable_PD6_BI);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001b687d;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001b687d:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNortekDVL->bEnable_PD6_BS);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001b68fe;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001b68fe:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNortekDVL->bEnable_PD6_BE);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      do {
        while ((pcVar2 = fgets(&local_138,0x100,__stream), local_138 != '#' && (local_138 != '%')))
        {
          if (((local_138 != '/') || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001b697f;
        }
      } while (pcVar2 != (char *)0x0);
LAB_001b697f:
      if (pcVar2 == (char *)0x0 || local_138 == '$') {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNortekDVL->bEnable_PD6_BD);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_001b69e5;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_001b69e5:
  if (pNortekDVL->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pNortekDVL->threadperiod = 100;
  }
  pNortekDVL->LastAltitude = 0.0;
  iVar1 = OpenRS232Port(&pNortekDVL->RS232Port,pNortekDVL->szDevPath);
  if (iVar1 == 0) {
    iVar1 = (pNortekDVL->RS232Port).DevType;
    if (3 < iVar1 - 1U) {
      if ((iVar1 != 0) ||
         (iVar1 = SetOptionsComputerRS232Port
                            ((pNortekDVL->RS232Port).hDev,pNortekDVL->BaudRate,'\0',0,'\b','\0',
                             pNortekDVL->timeout), iVar1 != 0)) {
        puts("Unable to connect to a NortekDVL.");
        CloseRS232Port(&pNortekDVL->RS232Port);
        goto LAB_001b6a2e;
      }
      tcflush(*(int *)&(pNortekDVL->RS232Port).hDev,2);
    }
    puts("NortekDVL connected.");
    iVar1 = 0;
  }
  else {
    puts("Unable to connect to a NortekDVL.");
LAB_001b6a2e:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int ConnectNortekDVL(NORTEKDVL* pNortekDVL, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pNortekDVL->szCfgFilePath, 0, sizeof(pNortekDVL->szCfgFilePath));
	sprintf(pNortekDVL->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pNortekDVL->szDevPath, 0, sizeof(pNortekDVL->szDevPath));
		sprintf(pNortekDVL->szDevPath, "COM1");
		pNortekDVL->BaudRate = 9600;
		pNortekDVL->timeout = 1500;
		pNortekDVL->threadperiod = 100;
		pNortekDVL->bSaveRawData = 1;
		pNortekDVL->bEnable_PD6_SA = 0;
		pNortekDVL->bEnable_PD6_TS = 0;
		pNortekDVL->bEnable_PD6_BI = 0;
		pNortekDVL->bEnable_PD6_BS = 1;
		pNortekDVL->bEnable_PD6_BE = 0;
		pNortekDVL->bEnable_PD6_BD = 0;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pNortekDVL->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->bEnable_PD6_SA) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->bEnable_PD6_TS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->bEnable_PD6_BI) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->bEnable_PD6_BS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->bEnable_PD6_BE) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNortekDVL->bEnable_PD6_BD) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pNortekDVL->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pNortekDVL->threadperiod = 100;
	}

	// Used to save raw data, should be handled specifically...
	//pNortekDVL->pfSaveFile = NULL;

	pNortekDVL->LastAltitude = 0;

	if (OpenRS232Port(&pNortekDVL->RS232Port, pNortekDVL->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a NortekDVL.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pNortekDVL->RS232Port, pNortekDVL->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pNortekDVL->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a NortekDVL.\n");
		CloseRS232Port(&pNortekDVL->RS232Port);
		return EXIT_FAILURE;
	}

	printf("NortekDVL connected.\n");

	return EXIT_SUCCESS;
}